

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_base64_decode(void)

{
  int iVar1;
  undefined1 auStack_38 [4];
  int ret;
  ptls_buffer_t buf;
  ptls_base64_decode_state_t state;
  
  ptls_buffer_init((ptls_buffer_t *)auStack_38,"",0);
  ptls_base64_decode_init((ptls_base64_decode_state_t *)&buf.is_allocated);
  iVar1 = ptls_base64_decode("aGVsbG8gd29ybGQ=",(ptls_base64_decode_state_t *)&buf.is_allocated,
                             (ptls_buffer_t *)auStack_38);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x195);
  _ok((uint)(buf.capacity == 0xb),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x196);
  iVar1 = memcmp(_auStack_38,"hello world",0xb);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x197);
  buf.capacity = 0;
  ptls_base64_decode_init((ptls_base64_decode_state_t *)&buf.is_allocated);
  iVar1 = ptls_base64_decode("a$b",(ptls_base64_decode_state_t *)&buf.is_allocated,
                             (ptls_buffer_t *)auStack_38);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x19d);
  buf.capacity = 0;
  ptls_base64_decode_init((ptls_base64_decode_state_t *)&buf.is_allocated);
  iVar1 = ptls_base64_decode(anon_var_dwarf_bcc5,(ptls_base64_decode_state_t *)&buf.is_allocated,
                             (ptls_buffer_t *)auStack_38);
  _ok((uint)(iVar1 != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x1a5);
  ptls_buffer_dispose((ptls_buffer_t *)auStack_38);
  return;
}

Assistant:

static void test_base64_decode(void)
{
    ptls_base64_decode_state_t state;
    ptls_buffer_t buf;
    int ret;

    ptls_buffer_init(&buf, "", 0);

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("aGVsbG8gd29ybGQ=", &state, &buf);
    ok(ret == 0);
    ok(buf.off == 11);
    ok(memcmp(buf.base, "hello world", 11) == 0);

    buf.off = 0;

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("a$b", &state, &buf);
    ok(ret != 0);

    buf.off = 0;

    ptls_base64_decode_init(&state);
    ret = ptls_base64_decode("a\xFF"
                             "b",
                             &state, &buf);
    ok(ret != 0);

    ptls_buffer_dispose(&buf);
}